

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
ImageT<unsigned_short,_4U>::resample
          (ImageT<unsigned_short,_4U> *this,uint32_t targetWidth,uint32_t targetHeight,char *filter,
          float filterScale,Boundary_Op wrapMode)

{
  Color *pCVar1;
  format_args args;
  string_view fmt;
  byte bVar2;
  unsigned_short uVar3;
  uint uVar4;
  pointer pIVar5;
  uint *puVar6;
  runtime_error *this_00;
  pointer pRVar7;
  unsigned_short *puVar8;
  reference pvVar9;
  reference pvVar10;
  value_type pfVar11;
  reference ppfVar12;
  int in_ECX;
  int iVar13;
  uint in_EDX;
  long in_RSI;
  v10 *this_01;
  __uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true> in_RDI;
  undefined4 in_R9D;
  undefined4 in_XMM0_Da;
  value_type vVar14;
  float fVar15;
  unsigned_short unormValue;
  float outValue;
  float linearValue;
  uint32_t c_3;
  Color *targetPixel;
  uint32_t targetX;
  uint32_t c_2;
  array<const_float_*,_4UL> outputLine;
  uint32_t c_1;
  float value;
  uint32_t c;
  Color *sourcePixel;
  uint32_t sourceX;
  uint32_t sourceY;
  uint32_t targetY;
  TransferFunction *tf;
  TransferFunctionLinear tfLinear;
  TransferFunctionSRGB tfSRGB;
  uint32_t i;
  bool isHDR;
  array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL> resamplers
  ;
  array<std::vector<float,_std::allocator<float>_>,_4UL> samples;
  uint32_t sourceHeight;
  uint32_t sourceWidth;
  __single_object target;
  unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *in_stack_fffffffffffffc88;
  array<std::vector<float,_std::allocator<float>_>,_4UL> *in_stack_fffffffffffffc90;
  unique_ptr<ImageT<unsigned_short,_4U>,_std::default_delete<ImageT<unsigned_short,_4U>_>_>
  *in_stack_fffffffffffffc98;
  array<std::vector<float,_std::allocator<float>_>,_4UL> *in_stack_fffffffffffffca0;
  Contrib_List **__new_size;
  uint *in_stack_fffffffffffffcb0;
  vector<float,_std::allocator<float>_> *this_02;
  uint *in_stack_fffffffffffffcb8;
  undefined6 in_stack_fffffffffffffcd0;
  undefined2 in_stack_fffffffffffffcd6;
  undefined4 in_stack_fffffffffffffcd8;
  undefined2 in_stack_fffffffffffffcdc;
  undefined2 in_stack_fffffffffffffcde;
  undefined2 in_stack_fffffffffffffce0;
  undefined2 in_stack_fffffffffffffce2;
  undefined4 in_stack_fffffffffffffce4;
  Resampler *local_318;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  float *in_stack_fffffffffffffd08;
  Resampler *pRVar16;
  undefined4 in_stack_fffffffffffffd10;
  float in_stack_fffffffffffffd14;
  Resampler *in_stack_fffffffffffffd18;
  Resampler *resampler;
  Contrib_List **in_stack_fffffffffffffd20;
  float *in_stack_fffffffffffffd28;
  Contrib_List *__args_13;
  bool local_277;
  uint local_26c;
  uint local_260;
  uint local_25c;
  undefined1 local_258 [36];
  uint local_234;
  float local_230;
  uint local_22c;
  color<unsigned_short,_4U> *local_228;
  uint local_21c;
  uint local_218;
  int local_214;
  Resampler *local_210;
  Resampler local_208 [8];
  Resampler local_200 [8];
  uint local_1f8;
  Boundary_Op local_1f4;
  Contrib_List *local_1f0;
  undefined1 local_1e8 [12];
  undefined1 local_1dc [12];
  uint local_1d0;
  undefined1 local_1c9;
  float local_1c8 [33];
  undefined1 local_141;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  local_140;
  char *local_130 [2];
  string local_120 [24];
  undefined8 in_stack_fffffffffffffef8;
  uint uVar17;
  uint uVar18;
  undefined8 in_stack_ffffffffffffff08;
  unique_ptr<ImageT<unsigned_short,_4U>,_std::default_delete<ImageT<unsigned_short,_4U>_>_> local_e8
  ;
  int local_e0;
  uint local_dc [5];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_c8 [3];
  undefined8 local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_a8;
  char *local_a0;
  size_t local_98;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_90;
  char *local_88;
  size_t sStack_80;
  string *local_78;
  char *local_70;
  char **local_68;
  char *local_60;
  char **local_58;
  char **local_50;
  char *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_20;
  undefined8 local_18;
  undefined8 *local_10;
  char *local_8;
  
  local_e0 = in_ECX;
  local_dc[0] = in_EDX;
  std::make_unique<ImageT<unsigned_short,4u>,unsigned_int&,unsigned_int&>
            (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  pIVar5 = std::
           unique_ptr<ImageT<unsigned_short,_4U>,_std::default_delete<ImageT<unsigned_short,_4U>_>_>
           ::operator->((unique_ptr<ImageT<unsigned_short,_4U>,_std::default_delete<ImageT<unsigned_short,_4U>_>_>
                         *)0x24bb4b);
  Image::setTransferFunction(&pIVar5->super_Image,*(khr_df_transfer_e *)(in_RSI + 0x10));
  pIVar5 = std::
           unique_ptr<ImageT<unsigned_short,_4U>,_std::default_delete<ImageT<unsigned_short,_4U>_>_>
           ::operator->((unique_ptr<ImageT<unsigned_short,_4U>,_std::default_delete<ImageT<unsigned_short,_4U>_>_>
                         *)0x24bb6b);
  Image::setPrimaries(&pIVar5->super_Image,*(khr_df_primaries_e *)(in_RSI + 0x14));
  uVar18 = *(uint *)(in_RSI + 8);
  uVar17 = *(uint *)(in_RSI + 0xc);
  local_277 = false;
  if (((uVar18 != 0) && (local_277 = false, uVar17 != 0)) && (local_277 = false, local_dc[0] != 0))
  {
    local_277 = local_e0 != 0;
  }
  if (local_277) {
    this_01 = (v10 *)&stack0xffffffffffffff00;
    puVar6 = std::max<unsigned_int>((uint *)&stack0xffffffffffffff04,(uint *)this_01);
    if (*puVar6 < 0x4001) {
      this_01 = (v10 *)&local_e0;
      puVar6 = std::max<unsigned_int>(local_dc,(uint *)this_01);
      if (*puVar6 < 0x4001) {
        std::array<std::vector<float,_std::allocator<float>_>,_4UL>::array
                  (in_stack_fffffffffffffca0);
        std::array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
        ::array((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                 *)in_stack_fffffffffffffca0);
        local_1c9 = 0;
        for (local_1d0 = 0; local_1d0 < 4; local_1d0 = local_1d0 + 1) {
          local_1dc._0_4_ = 0;
          local_1e8._8_4_ = 0x3f800000;
          if (local_1d0 == 0) {
            __args_13 = (Contrib_List *)0x0;
          }
          else {
            std::
            array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
            ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                          *)in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
            pRVar7 = std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
                     operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                 *)0x24bf97);
            __args_13 = basisu::Resampler::get_clist_x(pRVar7);
          }
          local_1e8._0_8_ = __args_13;
          if (local_1d0 == 0) {
            local_1f0 = (Contrib_List *)0x0;
          }
          else {
            std::
            array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
            ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                          *)in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
            pRVar7 = std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
                     operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                 *)0x24bfe6);
            local_1f0 = basisu::Resampler::get_clist_y(pRVar7);
          }
          local_1f4 = BOUNDARY_WRAP;
          local_1f8 = 0;
          this_02 = (vector<float,_std::allocator<float>_> *)&stack0xffffffffffffff14;
          __new_size = &local_1f0;
          in_stack_fffffffffffffca0 =
               (array<std::vector<float,_std::allocator<float>_>,_4UL> *)local_1e8;
          in_stack_fffffffffffffc98 = &local_e8;
          in_stack_fffffffffffffc90 =
               (array<std::vector<float,_std::allocator<float>_>,_4UL> *)(local_1e8 + 8);
          in_stack_fffffffffffffc88 =
               (unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)local_1dc;
          std::
          make_unique<basisu::Resampler,unsigned_int_const&,unsigned_int_const&,unsigned_int&,unsigned_int&,basisu::Resampler::Boundary_Op&,float,float,char_const*&,basisu::Resampler::Contrib_List*,basisu::Resampler::Contrib_List*,float&,float&,float,float>
                    ((uint *)CONCAT44(in_stack_fffffffffffffce4,
                                      CONCAT22(in_stack_fffffffffffffce2,in_stack_fffffffffffffce0))
                     ,(uint *)CONCAT26(in_stack_fffffffffffffcde,
                                       CONCAT24(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                                      ),
                     (uint *)CONCAT26(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0),
                     &local_1f8,&local_1f4,
                     (float *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                     in_stack_fffffffffffffd08,
                     (char **)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     (Contrib_List **)in_stack_fffffffffffffd18,in_stack_fffffffffffffd20,
                     in_stack_fffffffffffffd28,(float *)&stack0xfffffffffffffc88,(float *)local_1f0,
                     (float *)__args_13);
          in_stack_fffffffffffffd28 = local_1c8;
          std::
          array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>::
          operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                      *)in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
          in_stack_fffffffffffffd20 = (Contrib_List **)(local_1dc + 4);
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::operator=
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     in_stack_fffffffffffffc90);
          std::
          array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>::
          operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                      *)in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::operator*
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     in_stack_fffffffffffffc90);
          checkResamplerStatus
                    (in_stack_fffffffffffffd18,
                     (char *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
          std::array<std::vector<float,_std::allocator<float>_>,_4UL>::operator[]
                    (in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
          std::vector<float,_std::allocator<float>_>::resize(this_02,(size_type)__new_size);
        }
        TransferFunctionSRGB::TransferFunctionSRGB
                  ((TransferFunctionSRGB *)in_stack_fffffffffffffc90);
        TransferFunctionLinear::TransferFunctionLinear
                  ((TransferFunctionLinear *)in_stack_fffffffffffffc90);
        if (*(int *)(in_RSI + 0x10) == 2) {
          resampler = local_200;
        }
        else {
          resampler = local_208;
        }
        local_214 = 0;
        local_210 = resampler;
        for (local_218 = 0; local_218 < uVar17; local_218 = local_218 + 1) {
          for (local_21c = 0; local_21c < uVar18; local_21c = local_21c + 1) {
            local_228 = (color<unsigned_short,_4U> *)
                        (*(long *)(in_RSI + 0x18) + (ulong)(local_218 * uVar18 + local_21c) * 8);
            for (local_22c = 0; local_22c < 4; local_22c = local_22c + 1) {
              puVar8 = color<unsigned_short,_4U>::operator[](local_228,local_22c);
              in_stack_fffffffffffffd14 = (float)*puVar8;
              uVar3 = color_base<unsigned_short,_4U>::one();
              local_230 = in_stack_fffffffffffffd14 * (1.0 / (float)uVar3);
              pRVar16 = local_210;
              if (local_22c == 3) {
                pRVar16 = local_208;
              }
              vVar14 = (value_type)(**(code **)(*(long *)pRVar16 + 8))(local_230);
              pvVar9 = std::array<std::vector<float,_std::allocator<float>_>,_4UL>::operator[]
                                 (in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
              pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                  (pvVar9,(ulong)local_21c);
              *pvVar10 = vVar14;
            }
          }
          for (local_234 = 0; local_234 < 4; local_234 = local_234 + 1) {
            std::
            array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
            ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                          *)in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
            pRVar7 = std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
                     operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                 *)0x24c3e8);
            pvVar9 = std::array<std::vector<float,_std::allocator<float>_>,_4UL>::operator[]
                               (in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
            std::vector<float,_std::allocator<float>_>::operator[](pvVar9,0);
            bVar2 = basisu::Resampler::put_line((float *)pRVar7);
            if ((bVar2 & 1) == 0) {
              std::
              array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
              ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                            *)in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
              std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::operator*
                        ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                         in_stack_fffffffffffffc90);
              checkResamplerStatus
                        (resampler,
                         (char *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
            }
          }
          while( true ) {
            memset(local_258,0,0x20);
            for (local_25c = 0; local_25c < 4; local_25c = local_25c + 1) {
              std::
              array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
              ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                            *)in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
              std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
              operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                         0x24c4c1);
              pfVar11 = (value_type)basisu::Resampler::get_line();
              ppfVar12 = std::array<const_float_*,_4UL>::operator[]
                                   ((array<const_float_*,_4UL> *)in_stack_fffffffffffffc90,
                                    (size_type)in_stack_fffffffffffffc88);
              *ppfVar12 = pfVar11;
            }
            ppfVar12 = std::array<const_float_*,_4UL>::operator[]
                                 ((array<const_float_*,_4UL> *)in_stack_fffffffffffffc90,
                                  (size_type)in_stack_fffffffffffffc88);
            if (*ppfVar12 == (value_type)0x0) break;
            for (local_260 = 0; local_260 < local_dc[0]; local_260 = local_260 + 1) {
              pIVar5 = std::
                       unique_ptr<ImageT<unsigned_short,_4U>,_std::default_delete<ImageT<unsigned_short,_4U>_>_>
                       ::operator->((unique_ptr<ImageT<unsigned_short,_4U>,_std::default_delete<ImageT<unsigned_short,_4U>_>_>
                                     *)0x24c549);
              pCVar1 = pIVar5->pixels;
              iVar13 = local_214 * local_dc[0];
              for (local_26c = 0; local_26c < 4; local_26c = local_26c + 1) {
                ppfVar12 = std::array<const_float_*,_4UL>::operator[]
                                     ((array<const_float_*,_4UL> *)in_stack_fffffffffffffc90,
                                      (size_type)in_stack_fffffffffffffc88);
                if (local_26c == 3) {
                  local_318 = local_208;
                }
                else {
                  local_318 = local_210;
                }
                fVar15 = (float)(*(code *)**(undefined8 **)local_318)((*ppfVar12)[local_260]);
                uVar4 = std::isnan((double)(ulong)(uint)fVar15);
                if ((uVar4 & 1) == 0) {
                  if (0.0 <= fVar15) {
                    if (fVar15 <= 1.0) {
                      uVar3 = color_base<unsigned_short,_4U>::one();
                      uVar3 = (unsigned_short)(int)(fVar15 * (float)uVar3 + 0.5);
                    }
                    else {
                      uVar3 = color_base<unsigned_short,_4U>::one();
                    }
                  }
                  else {
                    uVar3 = 0;
                  }
                }
                else {
                  uVar3 = 0;
                }
                puVar8 = color<unsigned_short,_4U>::operator[]
                                   (pCVar1 + (iVar13 + local_260),local_26c);
                *puVar8 = uVar3;
              }
            }
            local_214 = local_214 + 1;
          }
        }
        std::unique_ptr<Image,std::default_delete<Image>>::
        unique_ptr<ImageT<unsigned_short,4u>,std::default_delete<ImageT<unsigned_short,4u>>,void>
                  ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffca0,
                   in_stack_fffffffffffffc98);
        TransferFunctionLinear::~TransferFunctionLinear((TransferFunctionLinear *)0x24c768);
        TransferFunctionSRGB::~TransferFunctionSRGB((TransferFunctionSRGB *)0x24c775);
        std::array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
        ::~array((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                  *)in_stack_fffffffffffffca0);
        std::array<std::vector<float,_std::allocator<float>_>,_4UL>::~array
                  (in_stack_fffffffffffffca0);
        std::
        unique_ptr<ImageT<unsigned_short,_4U>,_std::default_delete<ImageT<unsigned_short,_4U>_>_>::
        ~unique_ptr((unique_ptr<ImageT<unsigned_short,_4U>,_std::default_delete<ImageT<unsigned_short,_4U>_>_>
                     *)in_stack_fffffffffffffc90);
        return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
               (tuple<Image_*,_std::default_delete<Image>_>)
               in_RDI.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
               super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
               super__Head_base<0UL,_Image_*,_false>._M_head_impl;
      }
    }
    local_141 = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68 = local_130;
    local_70 = "Image larger than max supported size of {}";
    local_60 = "Image larger than max supported size of {}";
    local_130[0] = "Image larger than max supported size of {}";
    local_58 = local_68;
    local_98 = std::char_traits<char>::length((char_type *)0x24bcd6);
    local_8 = local_70;
    local_140.int_value = 0x4000;
    local_78 = local_120;
    local_88 = local_130[0];
    local_90 = &local_140;
    local_50 = &local_88;
    local_a0 = local_130[0];
    sStack_80 = local_98;
    local_48 = local_a0;
    sStack_40 = local_98;
    local_c8[0] = ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
                            ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int>
                              *)&local_90->string,this_01,(int *)local_78);
    local_30 = &local_b0;
    local_38 = local_c8;
    local_18 = 1;
    local_b0 = 1;
    fmt.size_._0_4_ = in_R9D;
    fmt.data_ = (char *)in_stack_ffffffffffffff08;
    fmt.size_._4_4_ = in_XMM0_Da;
    args.field_1._0_4_ = uVar17;
    args.desc_ = in_stack_fffffffffffffef8;
    args.field_1._4_4_ = uVar18;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    local_a8 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(fmt,args);
    std::runtime_error::runtime_error(this_00,local_120);
    local_141 = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __assert_fail("sourceWidth && sourceHeight && targetWidth && targetHeight",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x461,
                "virtual std::unique_ptr<Image> ImageT<unsigned short, 4>::resample(uint32_t, uint32_t, const char *, float, basisu::Resampler::Boundary_Op) [componentType = unsigned short, componentCount = 4]"
               );
}

Assistant:

virtual std::unique_ptr<Image> resample(uint32_t targetWidth, uint32_t targetHeight,
            const char* filter, float filterScale, basisu::Resampler::Boundary_Op wrapMode) override {
        using namespace basisu;

        auto target = std::make_unique<ImageT<componentType, componentCount>>(targetWidth, targetHeight);
        target->setTransferFunction(transferFunction);
        target->setPrimaries(primaries);

        const auto sourceWidth = width;
        const auto sourceHeight = height;
        assert(sourceWidth && sourceHeight && targetWidth && targetHeight);

        if (std::max(sourceWidth, sourceHeight) > BASISU_RESAMPLER_MAX_DIMENSION ||
                std::max(targetWidth, targetHeight) > BASISU_RESAMPLER_MAX_DIMENSION) {
            throw std::runtime_error(fmt::format(
                    "Image larger than max supported size of {}", BASISU_RESAMPLER_MAX_DIMENSION));
        }

        std::array<std::vector<float>, componentCount> samples;
        std::array<std::unique_ptr<Resampler>, componentCount> resamplers;

        // Float types handled as SFloat HDR otherwise UNROM LDR is assumed
        const auto isHDR = std::is_floating_point_v<componentType>;

        for (uint32_t i = 0; i < componentCount; ++i) {
            resamplers[i] = std::make_unique<Resampler>(
                    sourceWidth, sourceHeight,
                    targetWidth, targetHeight,
                    wrapMode,
                    0.0f, isHDR ? 0.0f : 1.0f,
                    filter,
                    i == 0 ? nullptr : resamplers[0]->get_clist_x(),
                    i == 0 ? nullptr : resamplers[0]->get_clist_y(),
                    filterScale, filterScale,
                    0.f, 0.f);
            checkResamplerStatus(*resamplers[i], filter);
            samples[i].resize(sourceWidth);
        }

        const TransferFunctionSRGB tfSRGB;
        const TransferFunctionLinear tfLinear;
        const TransferFunction& tf = transferFunction == KHR_DF_TRANSFER_SRGB ?
                static_cast<const TransferFunction&>(tfSRGB) :
                static_cast<const TransferFunction&>(tfLinear);

        uint32_t targetY = 0;
        for (uint32_t sourceY = 0; sourceY < sourceHeight; ++sourceY) {
            // Put source lines into resampler(s)
            for (uint32_t sourceX = 0; sourceX < sourceWidth; ++sourceX) {
                const auto& sourcePixel = pixels[sourceY * sourceWidth + sourceX];
                for (uint32_t c = 0; c < componentCount; ++c) {
                    const float value = std::is_floating_point_v<componentType> ?
                            sourcePixel[c] :
                            static_cast<float>(sourcePixel[c]) * (1.f / static_cast<float>(Color::one()));

                    // c == 3: Alpha channel always uses tfLinear
                    samples[c][sourceX] = (c == 3 ? tfLinear : tf).decode(value);
                }
            }

            for (uint32_t c = 0; c < componentCount; ++c)
                if (!resamplers[c]->put_line(&samples[c][0]))
                    checkResamplerStatus(*resamplers[c], filter);

            // Retrieve any output lines
            while (true) {
                std::array<const float*, componentCount> outputLine{nullptr};
                for (uint32_t c = 0; c < componentCount; ++c)
                    outputLine[c] = resamplers[c]->get_line();

                if (outputLine[0] == nullptr)
                    break; // No new output line, break from retrieve and place in a new source line

                for (uint32_t targetX = 0; targetX < targetWidth; ++targetX) {
                    Color& targetPixel = target->pixels[targetY * targetWidth + targetX];
                    for (uint32_t c = 0; c < componentCount; ++c) {
                        const auto linearValue = outputLine[c][targetX];

                        // c == 3: Alpha channel always uses tfLinear
                        const float outValue = (c == 3 ? tfLinear : tf).encode(linearValue);
                        if constexpr (std::is_floating_point_v<componentType>) {
                            targetPixel[c] = outValue;
                        } else {
                            const auto unormValue =
                                std::isnan(outValue) ? componentType{0} :
                                outValue < 0.f ? componentType{0} :
                                outValue > 1.f ? Color::one() :
                                static_cast<componentType>(outValue * static_cast<float>(Color::one()) + 0.5f);
                            targetPixel[c] = unormValue;
                        }
                    }
                }

                ++targetY;
            }
        }

        return target;
    }